

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_copy.c
# Opt level: O2

void test_copy(void)

{
  wchar_t wVar1;
  int iVar2;
  size_t v1;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  byte abStack_24b [3];
  char buff [260];
  char local_138 [264];
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                  ,L'ů',L'\0');
  filenames[0] = strdup("");
  filenames[1] = strdup("1");
  filenames[2] = strdup("a2");
  for (uVar6 = 3; uVar6 != 0xc9; uVar6 = uVar6 + 1) {
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      buff[uVar4] = (char)(uVar4 / 0x1a) * -0x1a + 'a' + (char)uVar4;
    }
    buff[uVar6] = '\0';
    abStack_24b[uVar6 + 2] = (byte)(uVar6 % 10) | 0x30;
    if (uVar6 < 10) {
      lVar5 = uVar6 - 2;
    }
    else {
      abStack_24b[uVar6 + 1] = (byte)((uVar6 / 10) % 10) | 0x30;
      if (uVar6 < 100) {
        lVar5 = uVar6 - 3;
      }
      else {
        lVar5 = uVar6 - 4;
        abStack_24b[uVar6] = (byte)(uVar6 / 100) | 0x30;
      }
    }
    buff[lVar5] = '_';
    v1 = strlen(buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                        ,L'\x81',v1,"strlen(buff)",uVar6,"i",(void *)0x0);
    pcVar3 = strdup(buff);
    filenames[uVar6] = pcVar3;
  }
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                   ,L'\x92');
    test_skipping("Symlink checks");
  }
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x95',"original",L'ǽ');
  iVar2 = chdir("original");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'\x96',0,"0",(long)iVar2,"chdir(\"original\")",(void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x99',"f",L'ǽ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x9a',"l",L'ǽ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x9b',"m",L'ǽ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x9c',"s",L'ǽ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'\x9d',"d",L'ǽ');
  for (uVar6 = 1; uVar6 != 200; uVar6 = uVar6 + 1) {
    failure("Internal sanity check failed: i = %d",uVar6 & 0xffffffff);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'¡',(uint)(filenames[uVar6] != (char *)0x0),"filenames[i] != NULL",
                     (void *)0x0);
    sprintf(buff,"f/%s",filenames[uVar6]);
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                        ,L'¤',buff,L'ǿ',L'\xffffffff',buff);
    sprintf(local_138,"l/%s",filenames[uVar6]);
    assertion_make_hardlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
               ,L'¨',local_138,buff);
    sprintf(local_138,"m/%s",filenames[uVar6]);
    assertion_make_hardlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
               ,L'¬',local_138,buff);
    wVar1 = canSymlink();
    if (wVar1 != L'\0') {
      sprintf(buff,"s/%s",filenames[uVar6]);
      sprintf(local_138,"../f/%s",filenames[uVar6]);
      failure("buff=\"%s\" buff2=\"%s\"",buff,local_138);
      assertion_make_symlink
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                 ,L'³',buff,local_138);
    }
    buff[0] = 'd';
    failure("buff=\"%s\"",buff);
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                       ,L'¸',buff,L'ǽ');
  }
  iVar2 = chdir("..");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'»',0,"0",(long)iVar2,"chdir(\"..\")",(void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'Ĥ',"plain",L'ǽ');
  iVar2 = chdir("plain");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ĥ',0,"0",(long)iVar2,"chdir(\"plain\")",(void *)0x0);
  wVar1 = systemf("%s cf archive -C ../original f d l m s >pack.out 2>pack.err",testprog);
  failure("Error invoking \"%s cf\"",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ĭ',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'İ',"pack.err");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'ı',"pack.out");
  wVar1 = systemf("%s xf archive >unpack.out 2>unpack.err",testprog);
  failure("Error invoking %s xf archive",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ĸ',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'Ļ',"unpack.err");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'ļ',"unpack.out");
  verify_tree(200);
  iVar2 = chdir("..");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'Ŀ',0,"0",(long)iVar2,"chdir(\"..\")",(void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                     ,L'Ŏ',"ustar",L'ǽ');
  iVar2 = chdir("ustar");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ŏ',0,"0",(long)iVar2,"chdir(target)",(void *)0x0);
  wVar1 = systemf("%s cf archive --format=ustar -C ../original f d l m s >pack.out 2>pack.err",
                  testprog);
  failure("Error invoking \"%s cf archive --format=ustar\"",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ŗ',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'Ś',"pack.out");
  wVar1 = systemf("%s xf archive >unpack.out 2>unpack.err",testprog);
  failure("Error invoking %s xf archive",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'ţ',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'Ŧ',"unpack.err");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
             ,L'ŧ',"unpack.out");
  verify_tree(100);
  iVar2 = chdir("../..");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_copy.c"
                      ,L'Ū',0,"0",(long)iVar2,"chdir(\"../..\")",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_copy)
{
	assertUmask(0);
	create_tree(); /* Create sample files in "original" dir. */

	/* Test simple "tar -c | tar -x" pipeline copy. */
	copy_basic();

	/* Same, but constrain to ustar format. */
	copy_ustar();
}